

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenIndex
BinaryenCallRefAppendOperand(BinaryenExpressionRef expr,BinaryenExpressionRef operandExpr)

{
  uintptr_t uVar1;
  
  if (expr->_id != CallRefId) {
    __assert_fail("expression->is<CallRef>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xfba,
                  "BinaryenIndex BinaryenCallRefAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    uVar1 = expr[1].type.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 1),
               operandExpr);
    return (BinaryenIndex)uVar1;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xfbb,
                "BinaryenIndex BinaryenCallRefAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

BinaryenIndex BinaryenCallRefAppendOperand(BinaryenExpressionRef expr,
                                           BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallRef>());
  assert(operandExpr);
  auto& list = static_cast<CallRef*>(expression)->operands;
  auto index = list.size();
  list.push_back((Expression*)operandExpr);
  return index;
}